

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_data.cpp
# Opt level: O3

void __thiscall duckdb::ErrorData::ErrorData(ErrorData *this,exception *ex)

{
  char *pcVar1;
  allocator local_31;
  string local_30;
  
  pcVar1 = (char *)(**(code **)(*(long *)ex + 0x10))(ex);
  ::std::__cxx11::string::string((string *)&local_30,pcVar1,&local_31);
  ErrorData(this,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

ErrorData::ErrorData(const std::exception &ex) : ErrorData(ex.what()) {
}